

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

void __thiscall NanoVM::push<unsigned_short>(NanoVM *this,unsigned_short value)

{
  unsigned_short value_local;
  NanoVM *this_local;
  
  if ((uchar *)((this->cpu).registers[7] + 2) < (this->cpu).stackBase + (this->cpu).stackSize) {
    *(unsigned_short *)((this->cpu).codeBase + (this->cpu).registers[7]) = value;
    (this->cpu).registers[7] = (this->cpu).registers[7] + 2;
  }
  else {
    this->errorFlag = 0x80;
  }
  return;
}

Assistant:

inline void NanoVM::push(T value) {
	// Check bounds
	if (sizeof(value) + cpu.registers[esp] >= reinterpret_cast<uint64_t>(cpu.stackBase) + cpu.stackSize) {
		// No room in stack.
		// Throw error or reallocate more pages
		errorFlag = STACK_ERROR;
		return;
	}
	// push to stack
	*reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp]) = value;
	// update stack pointer
	cpu.registers[esp] += sizeof(value);
}